

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
covenant::CFG::getNullablePositions
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,CFG *this,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *SymVec,
          set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
          *NullableSymbols)

{
  pointer pSVar1;
  uint uVar2;
  undefined8 in_RAX;
  size_type sVar3;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  uStack_28 = in_RAX;
  while( true ) {
    uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
    pSVar1 = (SymVec->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(SymVec->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 2) <= (ulong)uVar2
       ) break;
    sVar3 = std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::count
                      (NullableSymbols,pSVar1 + uVar2);
    if (sVar3 != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict2 *)((long)&uStack_28 + 4));
    }
    uVar2 = uStack_28._4_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned>  
    getNullablePositions(const vector<Sym> &SymVec, 
                         const set<Sym> &NullableSymbols)
    {
      vector<unsigned> positions;
      for (unsigned i=0; i < SymVec.size() ; i++)
      {		
        if (NullableSymbols.count(SymVec[i]) > 0)
          positions.push_back(i);
      }
      return positions;
    }